

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  uint uVar1;
  MessageLite *p_00;
  bool bVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  MessageLite *ptr_00;
  size_t extraout_RDX;
  undefined8 s;
  string_view val;
  MessageLite *local_1b8;
  undefined1 local_170 [4];
  int32_t size;
  string tmp_1;
  undefined1 local_148 [8];
  ParseContext tmp_ctx;
  char *p;
  MessageLite *value;
  bool local_b1;
  undefined1 local_b0 [7];
  bool was_packed_on_wire;
  ExtensionInfo extension;
  uint local_78 [2];
  uint64_t tmp;
  uint32_t tag;
  int local_60;
  uint local_5c;
  State state;
  uint32_t type_id;
  string payload;
  ParseContext *ctx_local;
  InternalMetadata *metadata_local;
  MessageLite *extendee_local;
  char *ptr_local;
  ExtensionSet *this_local;
  
  payload.field_2._8_8_ = ctx;
  extendee_local = (MessageLite *)ptr;
  ptr_local = (char *)this;
  std::__cxx11::string::string((string *)&state);
  local_5c = 0;
  local_60 = 0;
  do {
    while( true ) {
      while( true ) {
        bVar2 = ParseContext::Done((ParseContext *)payload.field_2._8_8_,(char **)&extendee_local);
        p_00 = extendee_local;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          this_local = (ExtensionSet *)extendee_local;
          extension.lazy_eager_verify_func._4_4_ = 1;
          goto LAB_002d5226;
        }
        ptr_00 = (MessageLite *)((long)&extendee_local->_vptr_MessageLite + 1);
        tmp._0_4_ = (uint)*(byte *)&extendee_local->_vptr_MessageLite;
        extendee_local = ptr_00;
        if ((uint)tmp != 0x10) break;
        extendee_local = (MessageLite *)ParseBigVarint((char *)ptr_00,(uint64_t *)local_78);
        if ((extendee_local == (MessageLite *)0x0) || (local_78[0] == 0)) {
          this_local = (ExtensionSet *)0x0;
          extension.lazy_eager_verify_func._4_4_ = 1;
          goto LAB_002d5226;
        }
        if (local_60 == 0) {
          local_5c = local_78[0];
          local_60 = 1;
        }
        else if (local_60 == 2) {
          local_5c = local_78[0];
          ExtensionInfo::ExtensionInfo((ExtensionInfo *)local_b0);
          s = payload.field_2._8_8_;
          bVar2 = FindExtension(this,2,local_5c,extendee,(ParseContext *)payload.field_2._8_8_,
                                (ExtensionInfo *)local_b0,&local_b1);
          uVar1 = local_5c;
          if (bVar2) {
            if ((extension.message._5_1_ & 1) == 0) {
              local_1b8 = MutableMessage(this,local_5c,'\v',(MessageLite *)extension._8_8_,
                                         (FieldDescriptor *)extension.field_6.message_info.tc_table)
              ;
            }
            else {
              local_1b8 = AddMessage(this,local_5c,'\v',(MessageLite *)extension._8_8_,
                                     (FieldDescriptor *)extension.field_6.message_info.tc_table);
            }
            ParseContext::ParseContext<std::__cxx11::string&>
                      ((ParseContext *)local_148,payload.field_2._8_8_,&tmp_ctx.data_.factory,&state
                      );
            pcVar5 = MessageLite::_InternalParse
                               (local_1b8,(char *)tmp_ctx.data_.factory,(ParseContext *)local_148);
            if ((pcVar5 == (char *)0x0) ||
               (bVar2 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_148), !bVar2))
            {
              this_local = (ExtensionSet *)0x0;
              extension.lazy_eager_verify_func._4_4_ = 1;
              goto LAB_002d5226;
            }
          }
          else {
            uVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&state);
            pbVar4 = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(metadata);
            val._M_str = (char *)pbVar4;
            val._M_len = extraout_RDX;
            WriteLengthDelimited((internal *)(ulong)uVar1,uVar3,val,(string *)s);
          }
          local_60 = 3;
        }
      }
      if ((uint)tmp != 0x1a) break;
      if (local_60 == 1) {
        extendee_local =
             (MessageLite *)
             ParseFieldMaybeLazily
                       (this,(ulong)local_5c * 8 + 2,(char *)ptr_00,extendee,metadata,
                        (ParseContext *)payload.field_2._8_8_);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          extension.lazy_eager_verify_func._4_4_ = 1;
          goto LAB_002d5226;
        }
        local_60 = 3;
      }
      else {
        std::__cxx11::string::string((string *)local_170);
        uVar3 = ReadSize((char **)&extendee_local);
        if (extendee_local == (MessageLite *)0x0) {
          this_local = (ExtensionSet *)0x0;
          extension.lazy_eager_verify_func._4_4_ = 1;
        }
        else {
          extendee_local =
               (MessageLite *)
               EpsCopyInputStream::ReadString
                         ((EpsCopyInputStream *)payload.field_2._8_8_,(char *)extendee_local,uVar3,
                          (string *)local_170);
          if (extendee_local == (MessageLite *)0x0) {
            this_local = (ExtensionSet *)0x0;
            extension.lazy_eager_verify_func._4_4_ = 1;
          }
          else {
            if (local_60 == 0) {
              std::__cxx11::string::operator=((string *)&state,(string *)local_170);
              local_60 = 2;
            }
            extension.lazy_eager_verify_func._4_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_170);
        if (extension.lazy_eager_verify_func._4_4_ != 0) goto LAB_002d5226;
      }
    }
    extendee_local = (MessageLite *)ReadTag((char *)p_00,(uint32_t *)&tmp,0);
    if (((uint)tmp == 0) || (((uint)tmp & 7) == 4)) {
      EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)payload.field_2._8_8_,(uint)tmp);
      this_local = (ExtensionSet *)extendee_local;
      extension.lazy_eager_verify_func._4_4_ = 1;
      goto LAB_002d5226;
    }
    extendee_local =
         (MessageLite *)
         ParseField(this,(ulong)(uint)tmp,(char *)extendee_local,extendee,metadata,
                    (ParseContext *)payload.field_2._8_8_);
  } while (extendee_local != (MessageLite *)0x0);
  this_local = (ExtensionSet *)0x0;
  extension.lazy_eager_verify_func._4_4_ = 1;
LAB_002d5226:
  std::__cxx11::string::~string((string *)&state);
  return (char *)this_local;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  enum class State { kNoTag, kHasType, kHasPayload, kDone };
  State state = State::kNoTag;

  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      // We should fail parsing if type id is 0 after cast to uint32.
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr &&
                                     static_cast<uint32_t>(tmp) != 0);
      if (state == State::kNoTag) {
        type_id = static_cast<uint32_t>(tmp);
        state = State::kHasType;
      } else if (state == State::kHasPayload) {
        type_id = static_cast<uint32_t>(tmp);
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools. Spawn a new
          // ParseContext inheriting those attributes.
          ParseContext tmp_ctx(ParseContext::kSpawn, *ctx, &p, payload);
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        state = State::kDone;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (state == State::kHasType) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        state = State::kDone;
      } else {
        std::string tmp;
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        if (state == State::kNoTag) {
          payload = std::move(tmp);
          state = State::kHasPayload;
        }
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}